

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O1

yyjson_mut_val *
duckdb_yyjson::yyjson_merge_patch(yyjson_mut_doc *doc,yyjson_val *orig,yyjson_val *patch)

{
  yyjson_val_pool *pool;
  void *pvVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  yyjson_mut_val *pyVar5;
  yyjson_mut_val *pyVar6;
  yyjson_mut_val *pyVar7;
  char *pcVar8;
  ulong uVar9;
  yyjson_val *pyVar10;
  yyjson_val *pyVar11;
  ulong uVar12;
  yyjson_mut_val *pyVar13;
  ulong uVar14;
  bool bVar15;
  yyjson_val *local_68;
  yyjson_val local_orig;
  
  if ((patch == (yyjson_val *)0x0) || ((~(uint)patch->tag & 7) != 0)) {
    pyVar5 = yyjson_val_mut_copy(doc,patch);
    return pyVar5;
  }
  if (doc != (yyjson_mut_doc *)0x0) {
    pool = &doc->val_pool;
    if (((doc->val_pool).end != (doc->val_pool).cur) ||
       (bVar15 = unsafe_yyjson_val_pool_grow(pool,&doc->alc,1), bVar15)) {
      pyVar5 = pool->cur;
      pool->cur = pyVar5 + 1;
    }
    else {
      pyVar5 = (yyjson_mut_val *)0x0;
    }
    if (pyVar5 != (yyjson_mut_val *)0x0) {
      pyVar5->tag = 7;
      goto LAB_00d0f381;
    }
  }
  pyVar5 = (yyjson_mut_val *)0x0;
LAB_00d0f381:
  if (pyVar5 == (yyjson_mut_val *)0x0) {
LAB_00d0f7b3:
    pyVar5 = (yyjson_mut_val *)0x0;
  }
  else {
    local_orig.tag = 0;
    local_orig.uni.u64 = 0;
    if ((orig == (yyjson_val *)0x0) || ((~(uint)orig->tag & 7) != 0)) {
      local_68 = (yyjson_val *)&stack0xffffffffffffffc8;
      local_orig.tag = pyVar5->tag;
      local_orig.uni = pyVar5->uni;
      orig = &local_orig;
    }
    else {
      local_68 = orig + 1;
    }
    if (orig != &local_orig) {
      if ((~(uint)orig->tag & 7) == 0) {
        uVar4 = orig->tag >> 8;
      }
      else {
        uVar4 = 0;
      }
      if (uVar4 != 0) {
        uVar9 = 0;
        pyVar10 = local_68;
        pyVar11 = orig;
        do {
          if (patch == (yyjson_val *)0x0) {
            bVar15 = false;
          }
          else {
            bVar15 = (~(uint)patch->tag & 7) == 0;
          }
          pvVar1 = (pyVar10->uni).ptr;
          if ((pvVar1 == (void *)0x0) || (!bVar15)) {
LAB_00d0f4cd:
            pyVar11 = (yyjson_val *)0x0;
          }
          else {
            bVar15 = patch->tag < 0x100;
            if (!bVar15) {
              uVar12 = pyVar10->tag >> 8;
              uVar14 = patch->tag >> 8;
              pyVar11 = patch + 1;
              do {
                if ((pyVar11->tag >> 8 == uVar12) &&
                   (iVar3 = bcmp((pyVar11->uni).ptr,pvVar1,uVar12), iVar3 == 0)) {
                  pyVar11 = pyVar11 + 1;
                  break;
                }
                pcVar8 = (char *)0x10;
                if ((~(uint)pyVar11[1].tag & 6) == 0) {
                  pcVar8 = pyVar11[1].uni.str;
                }
                pyVar11 = (yyjson_val *)(pcVar8 + (long)(pyVar11 + 1));
                uVar14 = uVar14 - 1;
                bVar15 = uVar14 == 0;
              } while (!bVar15);
            }
            if (bVar15) goto LAB_00d0f4cd;
          }
          if (pyVar11 == (yyjson_val *)0x0) {
            pyVar6 = yyjson_val_mut_copy(doc,pyVar10);
            pyVar7 = yyjson_val_mut_copy(doc,pyVar10 + 1);
            if ((~(uint)pyVar5->tag & 7) == 0) {
              if (pyVar6 == (yyjson_mut_val *)0x0) {
                bVar15 = false;
              }
              else {
                bVar15 = (pyVar6->tag & 7) == 5;
              }
              bVar15 = (bool)(pyVar7 != (yyjson_mut_val *)0x0 & bVar15);
            }
            else {
              bVar15 = false;
            }
            if (!bVar15) goto LAB_00d0f7b3;
            uVar12 = pyVar5->tag;
            pyVar13 = pyVar6;
            if (0xff < uVar12) {
              lVar2 = *(long *)((pyVar5->uni).u64 + 0x10);
              pyVar13 = *(yyjson_mut_val **)(lVar2 + 0x10);
              *(yyjson_mut_val **)(lVar2 + 0x10) = pyVar6;
            }
            pyVar7->next = pyVar13;
            pyVar6->next = pyVar7;
            (pyVar5->uni).str = (char *)pyVar6;
            pyVar5->tag = (uVar12 & 0xff) + (uVar12 & 0xffffffffffffff00) + 0x100;
            if (!bVar15) goto LAB_00d0f7b3;
          }
          pcVar8 = (char *)0x10;
          if ((~(uint)pyVar10[1].tag & 6) == 0) {
            pcVar8 = pyVar10[1].uni.str;
          }
          uVar9 = uVar9 + 1;
          pyVar10 = (yyjson_val *)(pcVar8 + (long)&pyVar10[1].tag);
        } while (uVar9 != uVar4);
      }
    }
    if (patch == (yyjson_val *)0x0) {
      uVar4 = 0;
    }
    else if ((~(uint)patch->tag & 7) == 0) {
      uVar4 = patch->tag >> 8;
    }
    else {
      uVar4 = 0;
    }
    if (uVar4 != 0) {
      pyVar10 = patch + 1;
      if (patch == (yyjson_val *)0x0) {
        pyVar10 = (yyjson_val *)0x0;
      }
      uVar9 = 0;
      do {
        if ((pyVar10[1].tag & 7) != 2) {
          pyVar6 = yyjson_val_mut_copy(doc,pyVar10);
          pvVar1 = (pyVar10->uni).ptr;
          if ((pvVar1 == (void *)0x0) || (((uint)orig->tag & 7) != 7)) {
LAB_00d0f6f9:
            pyVar11 = (yyjson_val *)0x0;
          }
          else {
            bVar15 = orig->tag < 0x100;
            pyVar11 = pyVar10;
            if (!bVar15) {
              uVar12 = pyVar10->tag >> 8;
              uVar14 = orig->tag >> 8;
              pyVar11 = local_68;
              do {
                if ((pyVar11->tag >> 8 == uVar12) &&
                   (iVar3 = bcmp((pyVar11->uni).ptr,pvVar1,uVar12), iVar3 == 0)) {
                  pyVar11 = pyVar11 + 1;
                  break;
                }
                pcVar8 = (char *)0x10;
                if ((~(uint)pyVar11[1].tag & 6) == 0) {
                  pcVar8 = pyVar11[1].uni.str;
                }
                pyVar11 = (yyjson_val *)(pcVar8 + (long)(pyVar11 + 1));
                uVar14 = uVar14 - 1;
                bVar15 = uVar14 == 0;
              } while (!bVar15);
            }
            if (bVar15) goto LAB_00d0f6f9;
          }
          pyVar7 = yyjson_merge_patch(doc,pyVar11,pyVar10 + 1);
          if ((~(uint)pyVar5->tag & 7) == 0) {
            if (pyVar6 == (yyjson_mut_val *)0x0) {
              bVar15 = false;
            }
            else {
              bVar15 = (pyVar6->tag & 7) == 5;
            }
            bVar15 = (bool)(pyVar7 != (yyjson_mut_val *)0x0 & bVar15);
          }
          else {
            bVar15 = false;
          }
          if (!bVar15) goto LAB_00d0f7b3;
          uVar12 = pyVar5->tag;
          pyVar13 = pyVar6;
          if (0xff < uVar12) {
            lVar2 = *(long *)((pyVar5->uni).u64 + 0x10);
            pyVar13 = *(yyjson_mut_val **)(lVar2 + 0x10);
            *(yyjson_mut_val **)(lVar2 + 0x10) = pyVar6;
          }
          pyVar7->next = pyVar13;
          pyVar6->next = pyVar7;
          (pyVar5->uni).str = (char *)pyVar6;
          pyVar5->tag = (uVar12 & 0xff) + (uVar12 & 0xffffffffffffff00) + 0x100;
          if (!bVar15) goto LAB_00d0f7b3;
        }
        pcVar8 = (char *)0x10;
        if ((~(uint)pyVar10[1].tag & 6) == 0) {
          pcVar8 = pyVar10[1].uni.str;
        }
        uVar9 = uVar9 + 1;
        pyVar10 = (yyjson_val *)(pcVar8 + (long)&pyVar10[1].tag);
      } while (uVar9 != uVar4);
    }
  }
  return pyVar5;
}

Assistant:

yyjson_mut_val *yyjson_merge_patch(yyjson_mut_doc *doc,
                                   yyjson_val *orig,
                                   yyjson_val *patch) {
    usize idx, max;
    yyjson_val *key, *orig_val, *patch_val, local_orig;
    yyjson_mut_val *builder, *mut_key, *mut_val, *merged_val;

    if (unlikely(!yyjson_is_obj(patch))) {
        return yyjson_val_mut_copy(doc, patch);
    }

    builder = yyjson_mut_obj(doc);
    if (unlikely(!builder)) return NULL;

    memset(&local_orig, 0, sizeof(local_orig));
    if (!yyjson_is_obj(orig)) {
        orig = &local_orig;
        orig->tag = builder->tag;
        orig->uni = builder->uni;
    }

    /* If orig is contributing, copy any items not modified by the patch */
    if (orig != &local_orig) {
        yyjson_obj_foreach(orig, idx, max, key, orig_val) {
            patch_val = yyjson_obj_getn(patch,
                                        unsafe_yyjson_get_str(key),
                                        unsafe_yyjson_get_len(key));
            if (!patch_val) {
                mut_key = yyjson_val_mut_copy(doc, key);
                mut_val = yyjson_val_mut_copy(doc, orig_val);
                if (!yyjson_mut_obj_add(builder, mut_key, mut_val)) return NULL;
            }
        }
    }

    /* Merge items modified by the patch. */
    yyjson_obj_foreach(patch, idx, max, key, patch_val) {
        /* null indicates the field is removed. */
        if (unsafe_yyjson_is_null(patch_val)) {
            continue;
        }
        mut_key = yyjson_val_mut_copy(doc, key);
        orig_val = yyjson_obj_getn(orig,
                                   unsafe_yyjson_get_str(key),
                                   unsafe_yyjson_get_len(key));
        merged_val = yyjson_merge_patch(doc, orig_val, patch_val);
        if (!yyjson_mut_obj_add(builder, mut_key, merged_val)) return NULL;
    }

    return builder;
}